

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialRuntimeObjects.cpp
# Opt level: O0

void __thiscall Lodtalk::SpecialRuntimeObjects::initialize(SpecialRuntimeObjects *this)

{
  WithoutGC local_18;
  WithoutGC wgc;
  SpecialRuntimeObjects *this_local;
  
  wgc.context = (VMContext *)this;
  WithoutGC::WithoutGC(&local_18,this->context);
  createSpecialObjectTable(this);
  createSpecialClassTable(this);
  registerGCRoots(this);
  WithoutGC::~WithoutGC(&local_18);
  return;
}

Assistant:

void SpecialRuntimeObjects::initialize()
{
    WithoutGC wgc(context);

    createSpecialObjectTable();
    createSpecialClassTable();
    registerGCRoots();
}